

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

path * __thiscall boost::filesystem::path::remove_trailing_separator(path *this)

{
  bool bVar1;
  ulong uVar2;
  value_type *pvVar3;
  long lVar4;
  path *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::size();
    pvVar3 = (value_type *)std::__cxx11::string::operator[]((ulong)this);
    bVar1 = anon_unknown.dwarf_f716::is_separator(*pvVar3);
    if (bVar1) {
      lVar4 = std::__cxx11::string::size();
      std::__cxx11::string::erase((ulong)this,lVar4 - 1);
    }
  }
  return this;
}

Assistant:

path&  path::remove_trailing_separator()
  {
    if (!m_pathname.empty() && is_separator(m_pathname[m_pathname.size() - 1]))
      m_pathname.erase(m_pathname.size() - 1);
    return *this;
  }